

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLtesting.c
# Opt level: O1

char ** RDL_calculate_pairwise_family
                  (char **cycle_array,uint nof_rings,uint nof_bonds,_func_int_void_ptr *stop)

{
  ulong uVar1;
  size_t __size;
  char *start_bonds;
  char *ring2_bonds;
  char *pcVar2;
  int iVar3;
  void *pvVar4;
  char **ppcVar5;
  void *__dest;
  char **current_rings;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  long local_48;
  
  if (nof_rings < 0xffff) {
    uVar14 = (ulong)nof_rings;
    pvVar4 = malloc(uVar14 * uVar14);
    if (pvVar4 != (void *)0x0) {
      uVar11 = 0;
      memset(pvVar4,0,uVar14 * uVar14);
      __size = uVar14 * 8;
      ppcVar5 = (char **)malloc(__size);
      if (nof_rings != 0) {
        uVar7 = 0;
        do {
          ppcVar5[uVar7] = (char *)((ulong)uVar11 + (long)pvVar4);
          uVar7 = uVar7 + 1;
          uVar11 = uVar11 + nof_rings;
        } while (uVar14 != uVar7);
      }
      pvVar4 = malloc(__size);
      uVar7 = (ulong)nof_bonds;
      if (nof_rings != 0) {
        uVar12 = 0;
        do {
          __dest = malloc(uVar7);
          *(void **)((long)pvVar4 + uVar12 * 8) = __dest;
          memcpy(__dest,cycle_array[uVar12],uVar7);
          uVar12 = uVar12 + 1;
        } while (uVar14 != uVar12);
      }
      current_rings = (char **)malloc(__size);
      if (nof_rings != 0) {
        local_48 = 1;
        uVar12 = 0;
        do {
          iVar3 = (*stop)((void *)0x0);
          if (iVar3 != 0) break;
          uVar1 = uVar12 + 1;
          lVar13 = local_48;
          if (uVar1 < uVar14) {
            do {
              iVar3 = (*stop)((void *)0x0);
              if (iVar3 != 0) break;
              uVar6 = 0;
              start_bonds = *(char **)((long)pvVar4 + uVar12 * 8);
              uVar11 = 0;
              if (nof_bonds != 0) {
                uVar8 = 0;
                uVar11 = 0;
                do {
                  uVar11 = (uVar11 + 1) - (uint)(start_bonds[uVar8] == '\0');
                  uVar8 = uVar8 + 1;
                } while (uVar7 != uVar8);
              }
              ring2_bonds = *(char **)((long)pvVar4 + lVar13 * 8);
              if (nof_bonds != 0) {
                uVar8 = 0;
                uVar6 = 0;
                do {
                  uVar6 = (uVar6 + 1) - (uint)(ring2_bonds[uVar8] == '\0');
                  uVar8 = uVar8 + 1;
                } while (uVar7 != uVar8);
              }
              if (uVar11 == uVar6 && nof_bonds != 0) {
                uVar8 = 0;
                iVar3 = 0;
                do {
                  if (start_bonds[uVar8] != '\0') {
                    iVar3 = (iVar3 + 1) - (uint)(ring2_bonds[uVar8] == '\0');
                  }
                  uVar8 = uVar8 + 1;
                } while (uVar7 != uVar8);
                if (iVar3 != 0) {
                  uVar8 = 0;
                  uVar9 = 0;
                  do {
                    pcVar2 = *(char **)((long)pvVar4 + uVar8 * 8);
                    uVar6 = 0;
                    if (nof_bonds != 0) {
                      uVar10 = 0;
                      uVar6 = 0;
                      do {
                        uVar6 = (uVar6 + 1) - (uint)(pcVar2[uVar10] == '\0');
                        uVar10 = uVar10 + 1;
                      } while (uVar7 != uVar10);
                    }
                    if (uVar6 < uVar11) {
                      current_rings[uVar9] = pcVar2;
                      uVar9 = (ulong)((int)uVar9 + 1);
                    }
                    uVar8 = uVar8 + 1;
                  } while (uVar8 != uVar14);
                  iVar3 = RDL_check_property3(start_bonds,nof_bonds,ring2_bonds,current_rings,
                                              (uint)uVar9,0,stop);
                  ppcVar5[uVar12][lVar13] = (char)iVar3;
                  ppcVar5[lVar13][uVar12] = (char)iVar3;
                }
              }
              lVar13 = lVar13 + 1;
            } while ((uint)lVar13 != nof_rings);
          }
          local_48 = local_48 + 1;
          uVar12 = uVar1;
        } while (uVar1 != uVar14);
        uVar7 = 0;
        do {
          free(*(void **)((long)pvVar4 + uVar7 * 8));
          uVar7 = uVar7 + 1;
        } while (uVar14 != uVar7);
      }
      free(pvVar4);
      free(current_rings);
      return ppcVar5;
    }
  }
  return (char **)0x0;
}

Assistant:

char** RDL_calculate_pairwise_family(const char** cycle_array,
                                  unsigned nof_rings,
                                  unsigned nof_bonds,
                                  int (*stop) (const void*))
{
  char* family_relation_data;
  char **family_relation, **ring_sets;
  const char **rings;
  const char *ring1, *ring2, *ring;
  unsigned i, j, k, ring1_count, ring2_count, intersection_count,
    ringcounter, ridx, ring_count;

  size_t matrix_size = nof_rings;

  if (nof_rings >= sqrt(UINT_MAX) - 1) {
    return NULL;
  }

  matrix_size *= nof_rings;

  /* first establish pairwise URF-relations */
  family_relation_data = malloc(matrix_size * sizeof(*family_relation_data));

  /* too much memory requested */
  if (!family_relation_data) {
    return NULL;
  }

  memset(family_relation_data, 0, matrix_size * sizeof(*family_relation_data));
  family_relation = malloc(nof_rings * sizeof(*family_relation));

  for (i = 0; i < nof_rings; ++i) {
    family_relation[i] = family_relation_data + i * nof_rings;
  }

  ring_sets = malloc(nof_rings * sizeof(*ring_sets));

  for (i = 0; i < nof_rings; ++i) {
    ring_sets[i] = malloc(nof_bonds * sizeof(**ring_sets));
    memcpy(ring_sets[i], cycle_array[i], nof_bonds);
  }

  rings = malloc(nof_rings * sizeof(*rings));

  for (i = 0; i < nof_rings && !stop(NULL); ++i) {
    for (j = i+1; j < nof_rings && !stop(NULL); ++j) {
      ring1 = ring_sets[i];
      ring2 = ring_sets[j];
      /* check property 1: |C1| == |C2| */
      ring1_count = RDL_count_bonds(ring1, nof_bonds);
      ring2_count = RDL_count_bonds(ring2, nof_bonds);
      if (ring1_count != ring2_count) {
        continue;
      }
      /* check property 2: C1 ^ C2 != o */
      intersection_count = 0;
      for (k = 0; k < nof_bonds; ++k) {
        if (ring1[k] && ring2[k]) {
          ++intersection_count;
        }
      }
      if (intersection_count == 0) {
        continue;
      }

      /*
       * check property 3: exists any subset of strictly smaller rings,
       * so the symmetric difference of ring 1 and a subset of
       * those smaller rings equals ring 2
       */
      ringcounter = 0;
      for(ridx = 0; ridx < nof_rings; ++ridx) {
        ring = ring_sets[ridx];
        ring_count = RDL_count_bonds(ring, nof_bonds);
        if (ring_count < ring1_count) {
          rings[ringcounter] = ring;
          ++ringcounter;
        }
      }

      family_relation[i][j] = RDL_check_property3(
          ring1, nof_bonds, ring2, rings, ringcounter, 0, stop);
      family_relation[j][i] = family_relation[i][j];
    }
  }

  for (i = 0; i < nof_rings; ++i) {
    free(ring_sets[i]);
  }

  free(ring_sets);
  free((void*)rings);

  return family_relation;
}